

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

string * __thiscall
testing::internal::GetPrefixUntilComma_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *str)

{
  char *pcVar1;
  long in_FS_OFFSET;
  allocator<char> local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = strchr((char *)this,0x2c);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)this,&local_19);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_00161c18;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_00161c18:
      __stack_chk_fail();
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,this,pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetPrefixUntilComma(const char* str) {
  const char* comma = strchr(str, ',');
  return comma == NULL ? str : std::string(str, comma);
}